

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O3

void Unr_ManProfileRanks(Vec_Int_t *vRanks)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  uint *__ptr;
  void *__s;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  
  uVar9 = vRanks->nSize;
  if ((ulong)uVar9 == 0) {
    __ptr = (uint *)malloc(0x10);
    uVar9 = 1;
LAB_00549908:
    *__ptr = 0x10;
    uVar8 = 0x10;
  }
  else {
    uVar8 = *vRanks->pArray;
    if (1 < (int)uVar9) {
      uVar6 = 1;
      do {
        uVar2 = vRanks->pArray[uVar6];
        if ((int)uVar8 <= (int)uVar2) {
          uVar8 = uVar2;
        }
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
    uVar9 = uVar8 + 1;
    __ptr = (uint *)malloc(0x10);
    if (uVar8 < 0xf) goto LAB_00549908;
    *__ptr = uVar9;
    uVar8 = uVar9;
    if (uVar9 == 0) {
      uVar9 = 0;
      __s = (void *)0x0;
      goto LAB_00549927;
    }
  }
  __s = malloc((long)(int)uVar8 << 2);
LAB_00549927:
  *(void **)(__ptr + 2) = __s;
  __ptr[1] = uVar9;
  uVar8 = 0;
  memset(__s,0,(long)(int)uVar9 << 2);
  iVar5 = vRanks->nSize;
  if (0 < (long)iVar5) {
    piVar4 = vRanks->pArray;
    lVar7 = 0;
    do {
      iVar3 = piVar4[lVar7];
      if (((long)iVar3 < 0) || ((int)uVar9 <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (int *)((long)__s + (long)iVar3 * 4);
      *piVar1 = *piVar1 + 1;
      lVar7 = lVar7 + 1;
    } while (iVar5 != lVar7);
  }
  if (0 < (int)uVar9) {
    uVar6 = 0;
    uVar8 = 0;
    do {
      uVar2 = *(uint *)((long)__s + uVar6 * 4);
      if (uVar2 != 0) {
        printf("%2d : %8d  (%6.2f %%)\n",((double)(int)uVar2 * 100.0) / (double)vRanks->nSize,
               uVar6 & 0xffffffff,(ulong)uVar2);
        uVar8 = uVar8 + uVar2 * (int)uVar6;
      }
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
    iVar5 = vRanks->nSize;
  }
  printf("Extra space = %d (%6.2f %%)  ",((double)(int)uVar8 * 100.0) / (double)iVar5,(ulong)uVar8);
  if (__s != (void *)0x0) {
    free(__s);
  }
  free(__ptr);
  return;
}

Assistant:

void Unr_ManProfileRanks( Vec_Int_t * vRanks )
{
    int RankMax = Vec_IntFindMax( vRanks );
    Vec_Int_t * vCounts = Vec_IntStart( RankMax+1 );
    int i, Rank, Count, nExtras = 0;
    Vec_IntForEachEntry( vRanks, Rank, i )
        Vec_IntAddToEntry( vCounts, Rank, 1 );
    Vec_IntForEachEntry( vCounts, Count, i )
    {
        if ( Count == 0 )
            continue;
        printf( "%2d : %8d  (%6.2f %%)\n", i, Count, 100.0 * Count / Vec_IntSize(vRanks) );
        nExtras += Count * i;
    }
    printf( "Extra space = %d (%6.2f %%)  ", nExtras, 100.0 * nExtras / Vec_IntSize(vRanks) );
    Vec_IntFree( vCounts );
}